

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

_Bool testbufferedxor16(size_t size)

{
  _Bool _Var1;
  xor16_t filter;
  
  puts("testing buffered xor16");
  _Var1 = test(size,0,&filter,xor16_allocate_gen,xor16_free_gen,xor16_size_in_bytes_gen,
               xor16_serialization_bytes_gen,xor16_serialize_gen,xor16_deserialize_gen,
               xor16_buffered_populate_gen,xor16_contain_gen);
  return _Var1;
}

Assistant:

bool testbufferedxor16(size_t size) {
  printf("testing buffered xor16\n");
  xor16_t filter;
  return test(size, 0, &filter,
              xor16_allocate_gen,
              xor16_free_gen,
              xor16_size_in_bytes_gen,
              xor16_serialization_bytes_gen,
              xor16_serialize_gen,
              xor16_deserialize_gen,
              xor16_buffered_populate_gen,
              xor16_contain_gen);
}